

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void write_slice_layer_rbsp(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  slice_data_rbsp_t *psVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *sptr;
  slice_data_rbsp_t *slice_data;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  if (h->nal->nal_unit_type == 0x14) {
    write_slice_header_in_scalable_extension(h,b);
  }
  else {
    write_slice_header(h,b);
  }
  psVar2 = h->slice_data;
  if (psVar2 == (slice_data_rbsp_t *)0x0) {
    write_rbsp_slice_trailing_bits(h,b);
  }
  else {
    if (psVar2->rbsp_buf != (uint8_t *)0x0) {
      free(psVar2->rbsp_buf);
    }
    puVar3 = b->p;
    iVar1 = b->bits_left;
    psVar2->rbsp_size = (int)b->end - (int)(puVar3 + (int)(uint)(iVar1 != 0));
    puVar4 = (uint8_t *)malloc((long)psVar2->rbsp_size);
    psVar2->rbsp_buf = puVar4;
    memcpy(psVar2->rbsp_buf,puVar3 + (int)(uint)(iVar1 != 0),(long)psVar2->rbsp_size);
  }
  return;
}

Assistant:

void write_slice_layer_rbsp(h264_stream_t* h,  bs_t* b)
{
    if (h->nal->nal_unit_type != NAL_UNIT_TYPE_CODED_SLICE_SVC_EXTENSION)
        write_slice_header(h, b);
    else
        write_slice_header_in_scalable_extension(h, b);
    
    slice_data_rbsp_t* slice_data = h->slice_data;

    if ( slice_data != NULL )
    {
        if ( slice_data->rbsp_buf != NULL ) free( slice_data->rbsp_buf ); 
        uint8_t *sptr = b->p + (!!b->bits_left); // CABAC-specific: skip alignment bits, if there are any
        slice_data->rbsp_size = b->end - sptr;
        
        slice_data->rbsp_buf = (uint8_t*)malloc(slice_data->rbsp_size);
        memcpy( slice_data->rbsp_buf, sptr, slice_data->rbsp_size );
        // ugly hack: since next NALU starts at byte border, we are going to be padded by trailing_bits;
        return;
    }

    // FIXME should read or skip data
    //slice_data( ); /* all categories of slice_data( ) syntax */
    write_rbsp_slice_trailing_bits(h, b);
}